

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextGLImpl::BindProgramResources(DeviceContextGLImpl *this,Uint32 BindSRBMask)

{
  SRBMaskType *pSVar1;
  byte bVar2;
  ShaderResourceCacheGL *this_00;
  pointer ppTVar3;
  pointer ppTVar4;
  TextureBaseGL *pTVar5;
  pointer ppBVar6;
  pointer ppBVar7;
  BufferGLImpl *pBVar8;
  Uint32 UVar9;
  uint uVar10;
  TBindings *BaseBindings;
  vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> *in_RCX;
  pointer ppTVar11;
  pointer ppBVar12;
  vector<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_> *in_R8;
  Uint32 sign;
  string msg;
  uint local_64;
  string local_60;
  vector<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_> *local_40;
  vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> *local_38;
  
  if (BindSRBMask == 0) {
    FormatString<char[26],char[17]>
              (&local_60,(Diligent *)"Debug expression failed:\n",(char (*) [26])"BindSRBMask != 0",
               (char (*) [17])in_RCX);
    in_RCX = (vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> *)0x2b2;
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"BindProgramResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x2b2);
    std::__cxx11::string::~string((string *)&local_60);
  }
  if ((this->m_BoundWritableTextures).
      super__Vector_base<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->m_BoundWritableTextures).
      super__Vector_base<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[32]>
              (&local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_BoundWritableTextures.empty()",(char (*) [32])in_RCX);
    in_RCX = (vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> *)0x2b6;
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"BindProgramResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x2b6);
    std::__cxx11::string::~string((string *)&local_60);
  }
  if ((this->m_BoundWritableBuffers).
      super__Vector_base<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->m_BoundWritableBuffers).
      super__Vector_base<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[31]>
              (&local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_BoundWritableBuffers.empty()",(char (*) [31])in_RCX);
    in_RCX = (vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> *)0x2b7;
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"BindProgramResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x2b7);
    std::__cxx11::string::~string((string *)&local_60);
  }
  local_38 = &this->m_BoundWritableTextures;
  this->m_CommittedResourcesTentativeBarriers = MEMORY_BARRIER_NONE;
  local_40 = &this->m_BoundWritableBuffers;
  while (BindSRBMask != 0) {
    uVar10 = 0;
    if (BindSRBMask != 0) {
      for (; (BindSRBMask >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
      }
    }
    local_64 = uVar10;
    UVar9 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetResourceSignatureCount
                      (&((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                         m_pPipelineState.m_pObject)->
                        super_PipelineStateBase<Diligent::EngineGLImplTraits>);
    if (UVar9 <= uVar10) {
      FormatString<char[26],char[53]>
                (&local_60,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"sign < m_pPipelineState->GetResourceSignatureCount()",
                 (char (*) [53])in_RCX);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"BindProgramResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x2bf);
      std::__cxx11::string::~string((string *)&local_60);
    }
    BaseBindings = PipelineStateGLImpl::GetBaseBindings
                             ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                              m_pPipelineState.m_pObject,local_64);
    *(undefined8 *)
     ((long)(&(this->m_BindInfo).super_CommittedShaderResources.CacheRevisions + 1) +
     (ulong)local_64 * 8 + 4) = *(undefined8 *)BaseBindings->_M_elems;
    this_00 = (this->m_BindInfo).super_CommittedShaderResources.ResourceCaches._M_elems[local_64];
    if (this_00 == (ShaderResourceCacheGL *)0x0) {
      FormatString<char[25],unsigned_int,char[9]>
                (&local_60,(Diligent *)"Resource cache at index ",(char (*) [25])&local_64,
                 (uint *)0x70da73,(char (*) [9])in_R8);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"BindProgramResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x2c6);
      std::__cxx11::string::~string((string *)&local_60);
    }
    uVar10 = -BindSRBMask & BindSRBMask;
    BindSRBMask = BindSRBMask ^ uVar10;
    if ((uVar10 & (this->m_BindInfo).super_CommittedShaderResources.StaleSRBMask) == 0) {
      bVar2 = (this->m_BindInfo).super_CommittedShaderResources.DynamicSRBMask;
      in_RCX = (vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> *)
               (ulong)bVar2;
      if ((uVar10 & bVar2) == 0) {
        FormatString<char[104]>
                  (&local_60,
                   (char (*) [104])
                   "When bit in StaleSRBMask is not set, the same bit in DynamicSRBMask must be set. Check GetCommitMask()."
                  );
        in_RCX = (vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> *)
                 0x2cc;
        DebugAssertionFailed
                  (local_60._M_dataplus._M_p,"BindProgramResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x2cc);
        std::__cxx11::string::~string((string *)&local_60);
      }
      if (this_00->m_DynamicSSBOMask == 0 && this_00->m_DynamicUBOMask == 0) {
        FormatString<char[209]>
                  (&local_60,
                   (char (*) [209])
                   "Bit in DynamicSRBMask is set, but the cache does not contain dynamic resources. This may indicate that resources in the cache have changed, but the SRB has not been committed before the draw/dispatch command."
                  );
        in_RCX = (vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> *)
                 0x2cf;
        DebugAssertionFailed
                  (local_60._M_dataplus._M_p,"BindProgramResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x2cf);
        std::__cxx11::string::~string((string *)&local_60);
      }
      ShaderResourceCacheGL::BindDynamicBuffers(this_00,&this->m_ContextState,BaseBindings);
    }
    else {
      in_RCX = local_38;
      in_R8 = local_40;
      ShaderResourceCacheGL::BindResources
                (this_00,&this->m_ContextState,BaseBindings,local_38,local_40);
    }
  }
  pSVar1 = &(this->m_BindInfo).super_CommittedShaderResources.StaleSRBMask;
  *pSVar1 = *pSVar1 & ~(this->m_BindInfo).super_CommittedShaderResources.ActiveSRBMask;
  ppTVar4 = (this->m_BoundWritableTextures).
            super__Vector_base<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppTVar3 = (this->m_BoundWritableTextures).
            super__Vector_base<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (ppTVar11 = ppTVar3; ppTVar11 != ppTVar4; ppTVar11 = ppTVar11 + 1) {
    pTVar5 = *ppTVar11;
    this->m_CommittedResourcesTentativeBarriers =
         this->m_CommittedResourcesTentativeBarriers | MEMORY_BARRIER_ALL_TEXTURE_BARRIERS;
    (pTVar5->super_AsyncWritableResource).m_PendingMemoryBarriers =
         (pTVar5->super_AsyncWritableResource).m_PendingMemoryBarriers |
         MEMORY_BARRIER_ALL_TEXTURE_BARRIERS;
  }
  if (ppTVar4 != ppTVar3) {
    (this->m_BoundWritableTextures).
    super__Vector_base<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppTVar3;
  }
  ppBVar7 = (this->m_BoundWritableBuffers).
            super__Vector_base<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppBVar6 = (this->m_BoundWritableBuffers).
            super__Vector_base<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (ppBVar12 = ppBVar6; ppBVar12 != ppBVar7; ppBVar12 = ppBVar12 + 1) {
    pBVar8 = *ppBVar12;
    this->m_CommittedResourcesTentativeBarriers =
         this->m_CommittedResourcesTentativeBarriers | MEMORY_BARRIER_ALL_BUFFER_BARRIERS;
    (pBVar8->super_AsyncWritableResource).m_PendingMemoryBarriers =
         (pBVar8->super_AsyncWritableResource).m_PendingMemoryBarriers |
         MEMORY_BARRIER_ALL_BUFFER_BARRIERS;
  }
  if (ppBVar7 != ppBVar6) {
    (this->m_BoundWritableBuffers).
    super__Vector_base<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppBVar6;
  }
  return;
}

Assistant:

void DeviceContextGLImpl::BindProgramResources(Uint32 BindSRBMask)
{
    VERIFY_EXPR(BindSRBMask != 0);
    //if (m_CommittedResourcesTentativeBarriers != 0)
    //    LOG_INFO_MESSAGE("Not all tentative resource barriers have been executed since the last call to CommitShaderResources(). Did you forget to call Draw()/DispatchCompute() ?");

    VERIFY_EXPR(m_BoundWritableTextures.empty());
    VERIFY_EXPR(m_BoundWritableBuffers.empty());

    m_CommittedResourcesTentativeBarriers = MEMORY_BARRIER_NONE;

    while (BindSRBMask != 0)
    {
        Uint32 SignBit = ExtractLSB(BindSRBMask);
        Uint32 sign    = PlatformMisc::GetLSB(SignBit);
        VERIFY_EXPR(sign < m_pPipelineState->GetResourceSignatureCount());
        const PipelineStateGLImpl::TBindings& BaseBindings = m_pPipelineState->GetBaseBindings(sign);
#ifdef DILIGENT_DEVELOPMENT
        m_BindInfo.BaseBindings[sign] = BaseBindings;
#endif

        const ShaderResourceCacheImplType* pResourceCache = m_BindInfo.ResourceCaches[sign];
        DEV_CHECK_ERR(pResourceCache != nullptr, "Resource cache at index ", sign, " is null");
        if (m_BindInfo.StaleSRBMask & SignBit)
            pResourceCache->BindResources(GetContextState(), BaseBindings, m_BoundWritableTextures, m_BoundWritableBuffers);
        else
        {
            VERIFY((m_BindInfo.DynamicSRBMask & SignBit) != 0,
                   "When bit in StaleSRBMask is not set, the same bit in DynamicSRBMask must be set. Check GetCommitMask().");
            DEV_CHECK_ERR(pResourceCache->HasDynamicResources(),
                          "Bit in DynamicSRBMask is set, but the cache does not contain dynamic resources. This may indicate that resources "
                          "in the cache have changed, but the SRB has not been committed before the draw/dispatch command.");
            pResourceCache->BindDynamicBuffers(GetContextState(), BaseBindings);
        }
    }
    m_BindInfo.StaleSRBMask &= ~m_BindInfo.ActiveSRBMask;


#if GL_ARB_shader_image_load_store
    // Go through the list of textures bound as AUVs and set the required memory barriers
    for (TextureBaseGL* pWritableTex : m_BoundWritableTextures)
    {
        constexpr MEMORY_BARRIER TextureMemBarriers = MEMORY_BARRIER_ALL_TEXTURE_BARRIERS;

        m_CommittedResourcesTentativeBarriers |= TextureMemBarriers;

        // Set new required barriers for the time when texture is used next time
        pWritableTex->SetPendingMemoryBarriers(TextureMemBarriers);
    }
    m_BoundWritableTextures.clear();

    for (BufferGLImpl* pWritableBuff : m_BoundWritableBuffers)
    {
        constexpr MEMORY_BARRIER BufferMemoryBarriers = MEMORY_BARRIER_ALL_BUFFER_BARRIERS;

        m_CommittedResourcesTentativeBarriers |= BufferMemoryBarriers;
        // Set new required barriers for the time when buffer is used next time
        pWritableBuff->SetPendingMemoryBarriers(BufferMemoryBarriers);
    }
    m_BoundWritableBuffers.clear();
#endif
}